

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

Vec_Wec_t * Sbd_ManWindowRoots(Gia_Man_t *p,int nTfoLevels,int nTfoFanMax)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  uint uVar4;
  int Id;
  int iVar5;
  int iVar6;
  int Entry;
  Vec_Wec_t *p_00;
  Vec_Wec_t *p_01;
  Vec_Bit_t *p_02;
  int *__s;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *pVVar9;
  Vec_Int_t *p_03;
  ulong uVar10;
  int *piVar11;
  int iVar12;
  size_t __size;
  int *piVar13;
  int *piVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  
  p_00 = Vec_WecStart(p->nObjs);
  p_01 = Vec_WecStart(p->nObjs);
  iVar12 = ((p->nObjs >> 5) + 1) - (uint)((p->nObjs & 0x1fU) == 0);
  p_02 = (Vec_Bit_t *)malloc(0x10);
  iVar17 = iVar12 * 0x20;
  p_02->nCap = iVar17;
  iVar16 = 0;
  if (iVar12 == 0) {
    __size = 0;
    __s = (int *)0x0;
  }
  else {
    __size = (long)iVar12 << 2;
    __s = (int *)malloc(__size);
  }
  p_02->pArray = __s;
  p_02->nSize = iVar17;
  memset(__s,0,__size);
  Gia_ManLevelNum(p);
  Gia_ManCreateRefs(p);
  Gia_ManCleanMark0(p);
  for (; iVar16 < p->vCis->nSize; iVar16 = iVar16 + 1) {
    pGVar7 = Gia_ManCi(p,iVar16);
    iVar12 = Gia_ObjId(p,pGVar7);
    if (iVar12 == 0) break;
    pVVar8 = Vec_WecEntry(p_01,iVar12);
    Vec_IntGrow(pVVar8,1);
    Vec_IntPush(pVVar8,iVar12);
  }
  for (iVar12 = 0; iVar12 < p->vCos->nSize; iVar12 = iVar12 + 1) {
    pGVar7 = Gia_ManCo(p,iVar12);
    uVar4 = Gia_ObjFaninId0p(p,pGVar7);
    if (((int)uVar4 < 0) || (iVar17 <= (int)uVar4)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
    }
    __s[uVar4 >> 5] = __s[uVar4 >> 5] | 1 << ((byte)uVar4 & 0x1f);
  }
  lVar18 = 0;
  do {
    if (p->nObjs <= lVar18) {
      Vec_WecFree(p_01);
      free(__s);
      free(p_02);
      return p_00;
    }
    iVar12 = (int)lVar18;
    pGVar7 = Gia_ManObj(p,iVar12);
    if ((~*(uint *)pGVar7 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar7) {
      iVar16 = Vec_BitEntry(p_02,iVar12);
      bVar15 = true;
      if (iVar16 == 0) {
        bVar15 = nTfoFanMax <= p->pRefs[lVar18];
      }
      pGVar7 = Gia_ManObj(p,iVar12);
      pVVar8 = Vec_WecEntry(p_01,iVar12 - (*(uint *)pGVar7 & 0x1fffffff));
      pGVar7 = Gia_ManObj(p,iVar12);
      pVVar9 = Vec_WecEntry(p_01,iVar12 - (*(uint *)&pGVar7->field_0x4 & 0x1fffffff));
      p_03 = Vec_WecEntry(p_01,iVar12);
      Vec_IntGrow(p_03,pVVar9->nSize + pVVar8->nSize);
      piVar3 = p_03->pArray;
      piVar13 = pVVar8->pArray;
      piVar11 = pVVar9->pArray;
      piVar1 = piVar13 + pVVar8->nSize;
      piVar2 = piVar11 + pVVar9->nSize;
      uVar10 = 0;
      piVar14 = piVar3;
      while ((piVar13 < piVar1 && (piVar11 < piVar2))) {
        iVar16 = *piVar13;
        iVar17 = *piVar11;
        if (iVar16 == iVar17) {
          piVar13 = piVar13 + 1;
          *piVar14 = iVar16;
          piVar11 = piVar11 + 1;
        }
        else if (iVar16 < iVar17) {
          piVar13 = piVar13 + 1;
          *piVar14 = iVar16;
        }
        else {
          piVar11 = piVar11 + 1;
          *piVar14 = iVar17;
        }
        piVar14 = piVar14 + 1;
        uVar10 = uVar10 + 4;
      }
      for (; piVar13 < piVar1; piVar13 = piVar13 + 1) {
        *piVar14 = *piVar13;
        piVar14 = piVar14 + 1;
        uVar10 = uVar10 + 4;
      }
      for (; piVar11 < piVar2; piVar11 = piVar11 + 1) {
        *(int *)((long)piVar3 + uVar10) = *piVar11;
        uVar10 = uVar10 + 4;
      }
      uVar10 = uVar10 >> 2;
      iVar16 = (int)uVar10;
      p_03->nSize = iVar16;
      if (p_03->nCap < iVar16) {
        __assert_fail("vArr->nSize <= vArr->nCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x72c,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      if (iVar16 < pVVar8->nSize) {
        __assert_fail("vArr->nSize >= vArr1->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x72d,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      if (iVar16 < pVVar9->nSize) {
        __assert_fail("vArr->nSize >= vArr2->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x72e,"void Vec_IntTwoMerge2Int(Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
      }
      iVar16 = 0;
      for (iVar17 = 0; iVar17 < (int)uVar10; iVar17 = iVar17 + 1) {
        Id = Vec_IntEntry(p_03,iVar17);
        if (bVar15) {
          iVar5 = Abc_Var2Lit(iVar12,1);
          Vec_WecPush(p_00,Id,iVar5);
        }
        else {
          iVar5 = Gia_ObjLevelId(p,iVar12);
          iVar6 = Gia_ObjLevelId(p,Id);
          Entry = Abc_Var2Lit(iVar12,(uint)(nTfoLevels <= iVar5 - iVar6));
          Vec_WecPush(p_00,Id,Entry);
          if (iVar5 - iVar6 < nTfoLevels) {
            Vec_IntWriteEntry(p_03,iVar16,Id);
            iVar16 = iVar16 + 1;
          }
        }
        uVar10 = (ulong)(uint)p_03->nSize;
      }
      Vec_IntShrink(p_03,iVar16);
      if (!bVar15) {
        Vec_IntPush(p_03,iVar12);
      }
    }
    lVar18 = lVar18 + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Sbd_ManWindowRoots( Gia_Man_t * p, int nTfoLevels, int nTfoFanMax )
{
    Vec_Wec_t * vTfos = Vec_WecStart( Gia_ManObjNum(p) ); // TFO nodes with roots marked
    Vec_Wec_t * vTemp = Vec_WecStart( Gia_ManObjNum(p) ); // storage
    Vec_Int_t * vNodes, * vNodes0, * vNodes1;
    Vec_Bit_t * vPoDrivers = Vec_BitStart( Gia_ManObjNum(p) );
    int i, k, k2, Id, Fan;
    Gia_ManLevelNum( p );
    Gia_ManCreateRefs( p );
    Gia_ManCleanMark0( p );
    Gia_ManForEachCiId( p, Id, i )
    {
        vNodes = Vec_WecEntry( vTemp, Id );
        Vec_IntGrow( vNodes, 1 );
        Vec_IntPush( vNodes, Id );
    }
    Gia_ManForEachCoDriverId( p, Id, i )
        Vec_BitWriteEntry( vPoDrivers, Id, 1 );
    Gia_ManForEachAndId( p, Id )
    {
        int fAlwaysRoot = Vec_BitEntry(vPoDrivers, Id) || (Gia_ObjRefNumId(p, Id) >= nTfoFanMax);
        vNodes0 = Vec_WecEntry( vTemp, Gia_ObjFaninId0(Gia_ManObj(p, Id), Id) );
        vNodes1 = Vec_WecEntry( vTemp, Gia_ObjFaninId1(Gia_ManObj(p, Id), Id) );
        vNodes = Vec_WecEntry( vTemp, Id );
        Vec_IntTwoMerge2( vNodes0, vNodes1, vNodes );
        k2 = 0;
        Vec_IntForEachEntry( vNodes, Fan, k )
        {
            int fRoot = fAlwaysRoot || (Gia_ObjLevelId(p, Id) - Gia_ObjLevelId(p, Fan) >= nTfoLevels);
            Vec_WecPush( vTfos, Fan, Abc_Var2Lit(Id, fRoot) );
            if ( !fRoot ) Vec_IntWriteEntry( vNodes, k2++, Fan );
        }
        Vec_IntShrink( vNodes, k2 );
        if ( !fAlwaysRoot )
            Vec_IntPush( vNodes, Id );
    }
    Vec_WecFree( vTemp );
    Vec_BitFree( vPoDrivers );

    // print the results
    if ( 0 )
    Vec_WecForEachLevel( vTfos, vNodes, i )
    {
        if ( !Gia_ObjIsAnd(Gia_ManObj(p, i)) )
            continue;
        printf( "Node %3d : ", i );
        Vec_IntForEachEntry( vNodes, Fan, k )
            printf( "%d%s ", Abc_Lit2Var(Fan), Abc_LitIsCompl(Fan)? "*":"" );
        printf( "\n" );
    }

    return vTfos;
}